

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_fx_add(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  uint64_t in_RDX;
  operand local_64 [3];
  string local_58;
  string error;
  
  this = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,this,in_RDX);
    std::__cxx11::string::operator=((string *)&error,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 5;
    local_64[0] = R11;
    local_64[1] = 0x39;
    local_64[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_58,local_64,local_64 + 1,(int *)(local_64 + 2));
    local_58._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_58,&error);
    local_58._M_dataplus._M_p._0_4_ = 0x5a;
    local_64[0] = RCX;
    local_64[1] = 0x39;
    local_64[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_58,local_64,local_64 + 1,(int *)(local_64 + 2));
    local_58._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_58,&error);
    local_58._M_dataplus._M_p._0_4_ = 0x5a;
    local_64[0] = RDX;
    local_64[1] = 0x39;
    local_64[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_58,local_64,local_64 + 1,(int *)(local_64 + 2));
    local_58._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_58,&error);
  }
  local_58._M_dataplus._M_p._0_4_ = 0x40;
  local_64[0] = RAX;
  local_64[1] = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_58,local_64,local_64 + 1);
  local_58._M_dataplus._M_p._0_4_ = 0;
  local_64[0] = RAX;
  local_64[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_58,local_64,local_64 + 1);
  local_58._M_dataplus._M_p._0_4_ = 0x2c;
  local_64[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_58,local_64);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_fx_add_contract_violation);
  }
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_fx_add(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::RDX);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_fx_add_contract_violation);
    }
  }